

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-def.cpp
# Opt level: O0

void __thiscall JitFFI::JitFuncCallerCreaterX64::sub_rsp(JitFuncCallerCreaterX64 *this)

{
  byte *pbVar1;
  JitFuncCallerCreaterX64 *this_local;
  
  OpCode_x64::sub_rx_byte(this->data,rsp,'\b');
  pbVar1 = JitFuncCreater::end(this->data);
  this->sub_rsp_ptr = pbVar1 + -1;
  return;
}

Assistant:

void JitFuncCallerCreaterX64::sub_rsp() {
		OpCode_x64::sub_rx_byte(data, OpCode_x64::rsp, 0x8);
		sub_rsp_ptr = data.end() - 1;
	}